

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::EasyHandle::Close(EasyHandle *this)

{
  ostream *this_00;
  void *this_01;
  EasyHandle *this_local;
  
  if (this->handle_ != (handle_t)0x0) {
    this_00 = std::operator<<((ostream *)&std::clog,"Cleaning easy-handle ");
    this_01 = (void *)std::ostream::operator<<(this_00,this->handle_);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    curl_easy_cleanup(this->handle_);
    this->handle_ = (handle_t)0x0;
  }
  return;
}

Assistant:

void Close() {
            if (handle_) {
                RESTINCURL_LOG("Cleaning easy-handle " << handle_);
                curl_easy_cleanup(handle_);
                handle_ = nullptr;
            }
        }